

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O0

SQRESULT sq_stackinfos(HSQUIRRELVM v,SQInteger level,SQStackInfos *si)

{
  CallInfo *pCVar1;
  SQObjectType SVar2;
  long lVar3;
  SQFunctionProto *this;
  SQInteger SVar4;
  SQFunctionProto *func;
  CallInfo *ci;
  SQInteger cssize;
  SQStackInfos *si_local;
  SQInteger level_local;
  HSQUIRRELVM v_local;
  
  lVar3 = v->_callsstacksize;
  if (level < lVar3) {
    si->funcname = (SQChar *)0x0;
    si->source = (SQChar *)0x0;
    si->line = 0;
    pCVar1 = v->_callsstack + ~level + lVar3;
    SVar2 = (pCVar1->_closure).super_SQObject._type;
    if (SVar2 == OT_CLOSURE) {
      this = ((pCVar1->_closure).super_SQObject._unVal.pClosure)->_function;
      if ((this->_name).super_SQObject._type == OT_STRING) {
        si->funcname = (SQChar *)&((this->_name).super_SQObject._unVal.pTable)->_firstfree;
      }
      if ((this->_sourcename).super_SQObject._type == OT_STRING) {
        si->source = (SQChar *)&((this->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
      }
      SVar4 = SQFunctionProto::GetLine(this,pCVar1->_ip);
      si->line = SVar4;
    }
    else if (SVar2 == OT_NATIVECLOSURE) {
      si->source = "NATIVE";
      si->funcname = "unknown";
      if ((((pCVar1->_closure).super_SQObject._unVal.pNativeClosure)->_name).super_SQObject._type ==
          OT_STRING) {
        si->funcname = (SQChar *)
                       (((pCVar1->_closure).super_SQObject._unVal.pFunctionProto)->_nlineinfos +
                       0x38);
      }
      si->line = -1;
    }
    v_local = (HSQUIRRELVM)0x0;
  }
  else {
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_stackinfos(HSQUIRRELVM v, SQInteger level, SQStackInfos *si)
{
    SQInteger cssize = v->_callsstacksize;
    if (cssize > level) {
        memset(si, 0, sizeof(SQStackInfos));
        SQVM::CallInfo &ci = v->_callsstack[cssize-level-1];
        switch (type(ci._closure)) {
        case OT_CLOSURE:{
            SQFunctionProto *func = _closure(ci._closure)->_function;
            if (type(func->_name) == OT_STRING)
                si->funcname = _stringval(func->_name);
            if (type(func->_sourcename) == OT_STRING)
                si->source = _stringval(func->_sourcename);
            si->line = func->GetLine(ci._ip);
                        }
            break;
        case OT_NATIVECLOSURE:
            si->source = _SC("NATIVE");
            si->funcname = _SC("unknown");
            if(type(_nativeclosure(ci._closure)->_name) == OT_STRING)
                si->funcname = _stringval(_nativeclosure(ci._closure)->_name);
            si->line = -1;
            break;
        default: break; //shutup compiler
        }
        return SQ_OK;
    }
    return SQ_ERROR;
}